

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t,Operand *a1)

{
  this->kind = k;
  Operand::Operand(&this->target,t);
  Operand::Operand(&this->arg1,a1);
  (this->arg2).kind = 0;
  (this->arg2).value._M_dataplus._M_p = (pointer)&(this->arg2).value.field_2;
  (this->arg2).value._M_string_length = 0;
  (this->arg2).value.field_2._M_local_buf[0] = '\0';
  (this->arg2).active = -1;
  return;
}

Assistant:

InterCode(int k, Operand t, Operand a1): kind(k), target(move(t)), arg1(move(a1)) {}